

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void utrie2_freeze_63(UTrie2 *trie,UTrie2ValueBits valueBits,UErrorCode *pErrorCode)

{
  uint32_t uVar1;
  UNewTrie2 *buffer;
  bool bVar2;
  short sVar3;
  int32_t *piVar4;
  undefined4 *puVar5;
  uint16_t *puVar6;
  uint32_t *puVar7;
  uint16_t uVar8;
  uint uVar9;
  int32_t *piVar10;
  int iVar11;
  int iVar12;
  UNewTrie2 *pUVar13;
  uint uVar14;
  uint uVar15;
  uint32_t *puVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  int32_t block;
  ulong uVar26;
  int32_t iVar27;
  uint uVar28;
  UNewTrie2 *newTrie;
  uint32_t local_64;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (trie == (UTrie2 *)0x0 || UTRIE2_32_VALUE_BITS < valueBits) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  buffer = trie->newTrie;
  if (buffer == (UNewTrie2 *)0x0) {
    if ((trie->data16 == (uint16_t *)0x0) == valueBits) {
      return;
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  if (buffer->isCompacted != '\0') goto LAB_002dbb41;
  local_64 = utrie2_get32_63(trie,0x10ffff);
  uVar1 = buffer->initialValue;
  iVar12 = -1;
  if (uVar1 == local_64) {
    iVar12 = buffer->index2NullOffset;
  }
  iVar23 = -1;
  if (uVar1 == local_64) {
    iVar23 = buffer->dataNullOffset;
  }
  lVar18 = 0x220;
  iVar20 = 0x110000;
  do {
    lVar21 = (long)(int)lVar18;
    while( true ) {
      lVar18 = lVar21 + -1;
      iVar22 = buffer->index1[lVar21 + -1];
      if (iVar22 != iVar12) break;
      bVar2 = iVar20 < 0x801;
      iVar20 = iVar20 + -0x800;
      lVar21 = lVar18;
      if (bVar2) goto LAB_002dbd3d;
    }
    if (iVar22 == buffer->index2NullOffset) {
      if (uVar1 != local_64) goto LAB_002dbd40;
      iVar20 = iVar20 + -0x800;
    }
    else {
      lVar21 = 0x40;
      iVar12 = iVar23;
      do {
        lVar19 = (long)(int)lVar21;
        while (iVar11 = iVar20, iVar23 = buffer->index2[(long)iVar22 + lVar19 + -1],
              iVar23 == iVar12) {
          bVar2 = lVar19 < 2;
          lVar19 = lVar19 + -1;
          iVar20 = iVar11 + -0x20;
          if (bVar2) {
            iVar20 = iVar11 + -0x20;
            iVar23 = iVar12;
            goto LAB_002dbd34;
          }
        }
        iVar20 = iVar11;
        if (iVar23 == buffer->dataNullOffset) {
          if (uVar1 != local_64) goto LAB_002dbd40;
        }
        else {
          uVar26 = 0x21;
          do {
            if (buffer->data[(long)iVar23 + (uVar26 - 2)] != local_64) goto LAB_002dbd40;
            iVar20 = iVar20 + -1;
            uVar26 = uVar26 - 1;
          } while (1 < uVar26);
        }
        iVar20 = iVar11 + -0x20;
        lVar21 = lVar19 + -1;
        iVar12 = iVar23;
      } while (1 < lVar19);
      iVar20 = iVar11 + -0x20;
    }
LAB_002dbd34:
    iVar12 = iVar22;
  } while (0 < iVar20);
LAB_002dbd3d:
  iVar20 = 0;
LAB_002dbd40:
  uVar28 = iVar20 + 0x7ffU & 0xfffff800;
  if (uVar28 == 0x110000) {
    local_64 = trie->errorValue;
  }
  buffer->highStart = uVar28;
  trie->highStart = uVar28;
  if ((int)uVar28 < 0x110000) {
    uVar9 = 0x10000;
    if (0x10000 < (int)uVar28) {
      uVar9 = uVar28;
    }
    utrie2_setRange32_63(trie,uVar9,0x10ffff,trie->initialValue,'\x01',pErrorCode);
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002dbdb5;
  }
  else {
LAB_002dbdb5:
    piVar10 = buffer->map;
    lVar18 = 0;
    piVar4 = piVar10;
    do {
      *piVar4 = (int32_t)lVar18;
      lVar18 = lVar18 + 0x20;
      piVar4 = piVar4 + 1;
    } while (lVar18 != 0xc0);
    uVar9 = 0xc0;
    if (0xc0 < buffer->dataLength) {
      uVar15 = 0x40;
      iVar12 = 2;
      uVar24 = 0xc0;
LAB_002dbe16:
      do {
        if (uVar24 == 0x880) {
          uVar15 = 0x20;
          iVar12 = 1;
        }
        iVar23 = (int)uVar24 >> 5;
        if (0 < piVar10[iVar23]) {
          puVar7 = buffer->data;
          iVar20 = -1;
          if (-1 < (int)(uVar9 - uVar15)) {
            lVar18 = 0;
            iVar22 = 0;
            puVar16 = puVar7;
            uVar14 = uVar15;
LAB_002dbe5e:
            do {
              if (*(uint32_t *)((long)puVar16 + lVar18) == puVar16[(int)uVar24]) {
                bVar2 = 1 < (int)uVar14;
                puVar16 = puVar16 + 1;
                uVar14 = uVar14 - 1;
                if (bVar2) goto LAB_002dbe5e;
                uVar14 = 0;
              }
              iVar20 = iVar22;
              if (uVar14 == 0) break;
              iVar22 = iVar22 + 4;
              lVar18 = lVar18 + 0x10;
              puVar16 = puVar7;
              uVar14 = uVar15;
              iVar20 = -1;
            } while (iVar22 <= (int)(uVar9 - uVar15));
          }
          if (iVar20 < 0) {
            lVar18 = (long)(int)uVar9;
            lVar21 = lVar18 * 4 + (ulong)uVar15 * -4;
            iVar20 = uVar15 + uVar24;
            uVar26 = (ulong)uVar15;
LAB_002dbf03:
            iVar20 = iVar20 + -4;
            lVar21 = lVar21 + 0x10;
            uVar17 = uVar26 - 4;
            iVar22 = (int)uVar17;
            if (4 < (long)uVar26) goto code_r0x002dbf12;
            if ((int)uVar24 <= (int)uVar9) {
              piVar4 = buffer->map + iVar23;
              iVar23 = iVar12 + 1;
              do {
                *piVar4 = uVar24;
                uVar24 = uVar24 + 0x20;
                piVar4 = piVar4 + 1;
                iVar23 = iVar23 + -1;
                uVar9 = uVar24;
              } while (1 < iVar23);
              goto LAB_002dbfe0;
            }
            goto LAB_002dbf48;
          }
          piVar4 = buffer->map + iVar23;
          iVar23 = iVar12 + 1;
          do {
            *piVar4 = iVar20;
            iVar20 = iVar20 + 0x20;
            piVar4 = piVar4 + 1;
            iVar23 = iVar23 + -1;
          } while (1 < iVar23);
        }
        uVar24 = uVar24 + uVar15;
      } while ((int)uVar24 < buffer->dataLength);
    }
LAB_002dbff9:
    if (0 < buffer->index2Length) {
      iVar12 = 0;
      do {
        if (iVar12 == 0x820) {
          iVar12 = 0xa60;
        }
        buffer->index2[iVar12] = buffer->map[buffer->index2[iVar12] >> 5];
        iVar12 = iVar12 + 1;
      } while (iVar12 < buffer->index2Length);
    }
    buffer->dataNullOffset = buffer->map[buffer->dataNullOffset >> 5];
    if ((uVar9 & 3) != 0) {
      puVar7 = buffer->data;
      uVar26 = (long)(int)uVar9;
      do {
        uVar17 = uVar26 + 1;
        puVar7[uVar26] = buffer->initialValue;
        uVar9 = uVar9 + 1;
        uVar26 = uVar17;
      } while ((uVar17 & 3) != 0);
    }
    buffer->dataLength = uVar9;
    if (0x10000 < (int)uVar28) {
      lVar18 = 0;
      piVar4 = piVar10;
      do {
        *piVar4 = (int32_t)lVar18;
        lVar18 = lVar18 + 0x40;
        piVar4 = piVar4 + 1;
      } while (lVar18 != 0x840);
      uVar28 = (buffer->highStart + -0x10000 >> 0xb) + 0x840;
      if (0xa60 < buffer->index2Length) {
        uVar9 = 0xa60;
LAB_002dc0e3:
        lVar19 = (long)(int)uVar9;
        lVar18 = lVar19 * 4 + 0x880;
        lVar21 = lVar19 * 4;
        do {
          iVar12 = -1;
          if (0x3f < (int)uVar28) {
            lVar25 = 0x880;
            uVar26 = 0;
            do {
              pUVar13 = buffer;
              uVar15 = 0x40;
              do {
                if (*(int *)((long)pUVar13->index1 + lVar25) !=
                    *(int *)((long)pUVar13->index1 + lVar18)) goto LAB_002dc134;
                pUVar13 = (UNewTrie2 *)(pUVar13->index1 + 1);
                bVar2 = 1 < uVar15;
                uVar15 = uVar15 - 1;
              } while (bVar2);
              uVar15 = 0;
LAB_002dc134:
              if (uVar15 == 0) {
                iVar12 = (int)uVar26;
                break;
              }
              uVar26 = uVar26 + 1;
              lVar25 = lVar25 + 4;
            } while (uVar26 != uVar28 - 0x3f);
          }
          iVar23 = (int)lVar19;
          iVar20 = iVar23 >> 6;
          if (iVar12 < 0) goto LAB_002dc17e;
          buffer->map[iVar20] = iVar12;
          lVar19 = lVar19 + 0x40;
          lVar18 = lVar18 + 0x100;
          lVar21 = lVar21 + 0x100;
          uVar9 = uVar9 + 0x40;
          if (buffer->index2Length <= lVar19) break;
        } while( true );
      }
LAB_002dc267:
      lVar18 = 0;
      do {
        buffer->index1[lVar18] = buffer->map[buffer->index1[lVar18] >> 6];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x220);
      buffer->index2NullOffset = buffer->map[buffer->index2NullOffset >> 6];
      if ((uVar28 & 3) != 0) {
        lVar18 = (long)(int)uVar28 + 0x220;
        do {
          iVar12 = (int)lVar18;
          buffer->index1[lVar18] = 0x3fffc;
          lVar18 = lVar18 + 1;
          uVar28 = uVar28 + 1;
        } while ((iVar12 - 0x21fU & 3) != 0);
      }
      buffer->index2Length = uVar28;
    }
    puVar7 = buffer->data;
    uVar28 = buffer->dataLength;
    buffer->dataLength = uVar28 + 1;
    while( true ) {
      puVar7[(int)uVar28] = local_64;
      uVar28 = buffer->dataLength;
      if ((uVar28 & 3) == 0) break;
      local_64 = trie->initialValue;
      buffer->dataLength = uVar28 + 1;
    }
    buffer->isCompacted = '\x01';
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
LAB_002dbb41:
  uVar28 = trie->highStart;
  iVar27 = 0x840;
  if (0x10000 < (int)uVar28) {
    iVar27 = buffer->index2Length;
  }
  iVar12 = 0;
  if (valueBits == UTRIE2_16_VALUE_BITS) {
    iVar12 = iVar27;
  }
  if ((((iVar27 < 0x10000) && (iVar12 < 0xf780)) && (buffer->dataNullOffset + iVar12 < 0x10000)) &&
     (iVar23 = buffer->dataLength, iVar23 + iVar12 < 0x3fffd)) {
    if (valueBits == UTRIE2_16_VALUE_BITS) {
      iVar23 = (iVar23 + iVar27) * 2;
    }
    else {
      iVar23 = iVar23 * 4 + iVar27 * 2;
    }
    puVar5 = (undefined4 *)uprv_malloc_63((long)(iVar23 + 0x10));
    trie->memory = puVar5;
    if (puVar5 == (undefined4 *)0x0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      trie->length = iVar23 + 0x10;
      trie->isMemoryOwned = '\x01';
      trie->indexLength = iVar27;
      uVar9 = buffer->dataLength;
      trie->dataLength = uVar9;
      uVar8 = 0xffff;
      if (0x10000 < (int)uVar28) {
        uVar8 = (uint16_t)buffer->index2NullOffset;
      }
      trie->index2NullOffset = uVar8;
      sVar3 = (short)iVar12;
      uVar8 = (short)buffer->dataNullOffset + sVar3;
      trie->dataNullOffset = uVar8;
      trie->highValueIndex = iVar12 + uVar9 + -4;
      *puVar5 = 0x54726932;
      *(short *)(puVar5 + 1) = (short)valueBits;
      *(short *)((long)puVar5 + 6) = (short)iVar27;
      *(short *)(puVar5 + 2) = (short)(uVar9 >> 2);
      *(uint16_t *)((long)puVar5 + 10) = trie->index2NullOffset;
      *(uint16_t *)(puVar5 + 3) = uVar8;
      *(short *)((long)puVar5 + 0xe) = (short)(uVar28 >> 0xb);
      puVar6 = (uint16_t *)(puVar5 + 4);
      trie->index = puVar6;
      uVar15 = 0x821;
      piVar10 = buffer->index2;
      do {
        iVar23 = *piVar10;
        piVar10 = piVar10 + 1;
        *puVar6 = (uint16_t)((uint)(iVar23 + iVar12) >> 2);
        puVar6 = puVar6 + 1;
        uVar15 = uVar15 - 1;
      } while (1 < uVar15);
      lVar18 = 0;
      do {
        *(short *)((long)puVar6 + lVar18) = sVar3 + 0x80;
        lVar18 = lVar18 + 2;
      } while ((int)lVar18 == 2);
      puVar7 = (uint32_t *)((long)puVar6 + lVar18);
      lVar18 = 0x112;
      do {
        *(short *)puVar7 = (short)buffer->index1[lVar18 * 2] + sVar3;
        puVar7 = (uint32_t *)((long)puVar7 + 2);
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x130);
      if (0x10000 < (int)uVar28) {
        uVar15 = uVar28 - 0x10000 >> 0xb;
        if (0x7ff < uVar28 - 0x10000) {
          piVar10 = buffer->index1 + 0x20;
          iVar23 = uVar15 + 1;
          do {
            iVar27 = *piVar10;
            piVar10 = piVar10 + 1;
            *(short *)puVar7 = (short)iVar27;
            puVar7 = (uint32_t *)((long)puVar7 + 2);
            iVar23 = iVar23 + -1;
          } while (1 < iVar23);
        }
        if ((int)(uVar15 + 0x840) < buffer->index2Length) {
          piVar10 = buffer->index2 + (uVar15 + 0x840);
          iVar23 = (buffer->index2Length - uVar15) + -0x83f;
          do {
            iVar20 = *piVar10;
            piVar10 = piVar10 + 1;
            *(short *)puVar7 = (short)((uint)(iVar20 + iVar12) >> 2);
            puVar7 = (uint32_t *)((long)puVar7 + 2);
            iVar23 = iVar23 + -1;
          } while (1 < iVar23);
        }
      }
      if ((valueBits & UTRIE2_32_VALUE_BITS) == UTRIE2_16_VALUE_BITS) {
        trie->data16 = (uint16_t *)puVar7;
        trie->data32 = (uint32_t *)0x0;
        if (0 < (int)uVar9) {
          puVar16 = buffer->data;
          iVar12 = uVar9 + 1;
          lVar18 = 0;
          do {
            *(undefined2 *)((long)puVar7 + lVar18) = *(undefined2 *)((long)puVar16 + lVar18 * 2);
            lVar18 = lVar18 + 2;
            iVar12 = iVar12 + -1;
          } while (1 < iVar12);
        }
      }
      else {
        trie->data16 = (uint16_t *)0x0;
        trie->data32 = puVar7;
        memcpy(puVar7,buffer->data,(long)(int)uVar9 << 2);
      }
      uprv_free_63(buffer->data);
      uprv_free_63(buffer);
      trie->newTrie = (UNewTrie2 *)0x0;
    }
  }
  else {
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return;
code_r0x002dbf12:
  uVar26 = uVar17 & 0xffffffff;
  puVar16 = puVar7;
  do {
    iVar11 = (int)uVar26;
    if (*(uint32_t *)((long)puVar16 + lVar21) != puVar16[(int)uVar24]) goto LAB_002dbf35;
    puVar16 = puVar16 + 1;
    uVar26 = (ulong)(iVar11 - 1);
  } while (1 < iVar11);
  iVar11 = 0;
LAB_002dbf35:
  uVar26 = uVar17;
  if (iVar11 == 0) goto LAB_002dbf48;
  goto LAB_002dbf03;
LAB_002dbf48:
  iVar11 = uVar9 - iVar22;
  piVar4 = buffer->map + iVar23;
  iVar23 = iVar12 + 1;
  do {
    *piVar4 = iVar11;
    iVar11 = iVar11 + 0x20;
    piVar4 = piVar4 + 1;
    iVar23 = iVar23 + -1;
  } while (1 < iVar23);
  if (uVar15 - iVar22 == 0 || (int)uVar15 < iVar22) {
    uVar24 = uVar24 + iVar22;
  }
  else {
    iVar23 = uVar15 - iVar22;
    do {
      puVar7[lVar18] = puVar7[iVar20];
      iVar22 = iVar23 + -1;
      puVar7 = puVar7 + 1;
      uVar9 = uVar9 + 1;
      bVar2 = 1 < iVar23;
      iVar23 = iVar22;
    } while (bVar2);
    uVar24 = (uVar24 + uVar15) - iVar22;
  }
LAB_002dbfe0:
  if (buffer->dataLength <= (int)uVar24) goto LAB_002dbff9;
  goto LAB_002dbe16;
LAB_002dc17e:
  lVar18 = (long)(int)uVar28 * 4 + 0x784;
  uVar26 = 0x3f;
  do {
    uVar17 = uVar26 & 0xffffffff;
    pUVar13 = buffer;
    do {
      iVar12 = (int)uVar17;
      if (*(int *)((long)pUVar13->index1 + lVar18) !=
          *(int *)((long)pUVar13->index2 + ((lVar21 << 0x1e) >> 0x1e))) goto LAB_002dc1c2;
      pUVar13 = (UNewTrie2 *)(pUVar13->index1 + 1);
      uVar17 = (ulong)(iVar12 - 1);
    } while (1 < iVar12);
    iVar12 = 0;
LAB_002dc1c2:
    if (iVar12 == 0) goto LAB_002dc1de;
    lVar18 = lVar18 + 4;
    bVar2 = 1 < uVar26;
    uVar26 = uVar26 - 1;
  } while (bVar2);
  uVar26 = 0;
  if ((int)uVar28 < iVar23) {
LAB_002dc1de:
    iVar12 = (int)uVar26;
    piVar10[iVar20] = uVar28 - iVar12;
    if (iVar12 < 0x40) {
      piVar4 = buffer->index2;
      iVar23 = 0;
      do {
        piVar4[(int)uVar28] = piVar4[(int)(uVar9 + iVar12)];
        piVar4 = piVar4 + 1;
        iVar20 = iVar23 + -1;
        iVar22 = iVar23 - iVar12;
        iVar23 = iVar20;
      } while (1 < iVar22 + 0x40);
      uVar28 = uVar28 - iVar20;
      uVar9 = (uVar9 + iVar12) - iVar20;
    }
    else {
      uVar9 = iVar12 + iVar23;
    }
  }
  else {
    piVar10[iVar20] = iVar23;
    uVar28 = iVar23 + 0x40;
    uVar9 = uVar28;
  }
  if (buffer->index2Length <= (int)uVar9) goto LAB_002dc267;
  goto LAB_002dc0e3;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }